

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O1

int decode_nal_units(HEVCContext *h,uint8_t *bs,uint64_t bs_len)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint8_t *puVar12;
  bool bVar13;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)(int)(uVar3 + 3);
    bVar13 = uVar4 < bs_len;
    if (!bVar13) {
      return 0;
    }
    lVar11 = (long)(int)uVar3;
    while (((bs[lVar11] != '\0' || (bs[lVar11 + 1] != '\0')) || (bs[lVar11 + 2] != '\x01'))) {
      uVar4 = lVar11 + 4;
      bVar13 = uVar4 < bs_len;
      lVar11 = lVar11 + 1;
      if (!bVar13) {
        return 0;
      }
    }
    if (!bVar13) {
      return 0;
    }
    h->nal_unit_type = bs[uVar4] >> 1 & (NAL_VPS|NAL_BLA_W_LP|NAL_RASL_N|NAL_RADL_R);
    iVar9 = (int)lVar11;
    uVar10 = iVar9 + 5;
    h->temporal_id = (bs[(long)iVar9 + 4] & 7) - 1;
    iVar2 = -1;
    uVar3 = uVar10;
    if ((ulong)(long)(iVar9 + 8) < bs_len) {
      uVar4 = (ulong)uVar10;
      do {
        uVar3 = (uint)uVar4;
        if (bs[(int)uVar3] == '\0') {
          if (uVar10 != uVar3) {
            uVar3 = uVar3 - (bs[(long)(int)uVar3 + -1] == '\0');
          }
          uVar4 = (long)(int)uVar3 + 2;
          if (((uVar4 < bs_len) && (bs[(long)(int)uVar3 + 1] == '\0')) && (bs[uVar4] < 4)) {
            iVar2 = uVar3 - uVar10;
            if (bs[uVar4] == 3) {
              iVar2 = -1;
            }
            break;
          }
        }
        else {
          uVar4 = (ulong)(uVar3 + 2);
        }
        uVar3 = (uint)uVar4;
      } while ((ulong)(long)(int)(uVar3 + 3) < bs_len);
    }
    puVar12 = bs + (int)uVar10;
    if (iVar2 == -1) {
      lVar11 = bs_len - (long)(int)uVar10;
      uVar4 = lVar11 + 0x10;
      if (h->rbsp_buffer_size < uVar4) {
        puVar7 = h->rbsp_buffer;
        if (puVar7 != (uint8_t *)0x0) {
          free(puVar7 + -(long)(char)puVar7[-1]);
          h->rbsp_buffer = (uint8_t *)0x0;
        }
        if (lVar11 - 0x7fffffd0U < 0xffffffff80000021) {
          puVar7 = (uint8_t *)0x0;
        }
        else {
          pvVar5 = malloc(lVar11 + 0x30);
          if (pvVar5 == (void *)0x0) {
            puVar7 = (uint8_t *)0x0;
          }
          else {
            puVar7 = (uint8_t *)((long)pvVar5 + 0x20U & 0xffffffffffffffe0);
            puVar7[-1] = ((byte)((long)pvVar5 + 0x20U) & 0xe0) - (char)pvVar5;
          }
        }
        h->rbsp_buffer = puVar7;
        if (puVar7 == (uint8_t *)0x0) {
          uVar4 = 0;
        }
        h->rbsp_buffer_size = uVar4;
      }
      puVar7 = h->rbsp_buffer;
      if (puVar7 != (uint8_t *)0x0) {
        iVar2 = uVar3 - uVar10;
        memcpy(puVar7,puVar12,(long)iVar2);
        while( true ) {
          uVar10 = uVar3 + 2;
          puVar12 = puVar7;
          if (bs_len <= (ulong)(long)(int)uVar10) break;
          if (bs[(int)uVar10] < 4) {
            if ((bs[(int)uVar3] != '\0') || (bs[(long)(int)uVar3 + 1] != '\0')) goto LAB_00104802;
            if (bs[(int)uVar10] != 3) goto LAB_00104870;
            (puVar7 + iVar2)[0] = '\0';
            (puVar7 + iVar2)[1] = '\0';
            iVar2 = iVar2 + 2;
            uVar3 = uVar3 + 3;
          }
          else {
            puVar7[iVar2] = bs[(int)uVar3];
            puVar7[(long)iVar2 + 1] = bs[(long)(int)uVar3 + 1];
            iVar2 = iVar2 + 2;
            uVar3 = uVar10;
LAB_00104802:
            lVar11 = (long)(int)uVar3;
            uVar3 = uVar3 + 1;
            lVar8 = (long)iVar2;
            iVar2 = iVar2 + 1;
            puVar7[lVar8] = bs[lVar11];
          }
        }
        uVar4 = (ulong)(int)uVar3;
        if (uVar4 < bs_len) {
          puVar7 = puVar7 + iVar2;
          iVar2 = (iVar2 + (int)bs_len) - uVar3;
          do {
            puVar1 = bs + uVar4;
            uVar4 = uVar4 + 1;
            *puVar7 = *puVar1;
            puVar7 = puVar7 + 1;
          } while (uVar4 < bs_len);
          uVar3 = (uint)uVar4;
        }
        goto LAB_00104870;
      }
      decode_nal_units_cold_1();
      bVar13 = false;
    }
    else {
LAB_00104870:
      uVar10 = iVar2 + 1;
      lVar11 = (long)iVar2;
      do {
        if (lVar11 == 0) {
          uVar10 = 0;
          break;
        }
        uVar10 = uVar10 - 1;
        lVar8 = lVar11 + -1;
        lVar11 = lVar11 + -1;
      } while (puVar12[lVar8] == '\0');
      uVar6 = uVar10 * 8;
      if (0xfffffff < uVar10) {
        uVar6 = 0xfffffff8;
      }
      uVar10 = uVar6;
      if (0x7ffffff7 < uVar6) {
        uVar10 = 0;
      }
      puVar7 = (uint8_t *)0x0;
      if (0x7ffffff7 >= uVar6) {
        puVar7 = puVar12;
      }
      if (puVar12 == (uint8_t *)0x0) {
        uVar10 = 0;
      }
      (h->gb).buffer = puVar7;
      (h->gb).size_in_bits = uVar10;
      (h->gb).size_in_bits_plus8 = uVar10 + 8;
      (h->gb).buffer_end = puVar7 + ((int)uVar10 >> 3);
      (h->gb).index = 0;
      decode_nal_unit(h);
      bVar13 = true;
    }
    if (!bVar13) {
      return -1;
    }
  } while( true );
}

Assistant:

int decode_nal_units(HEVCContext *h, const uint8_t *bs, uint64_t bs_len)
{
    //decode all NAL units in an Access Unit
    int ptr_bs = 0;
    while(1)
    {
        //1. parse NAL start code
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs] == 0 && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] == 1)
                break;
            ptr_bs++;
        }
        if(ptr_bs + 3 >= bs_len)
            break;
        ptr_bs += 3;

        //2. NAL Unit header
        h->nal_unit_type = (enum NALUnitType)((bs[ptr_bs++] & 0x7F) >> 1);
        h->temporal_id = (bs[ptr_bs++] & 0x7) - 1;

        //3. Extract emulated code
        int ptr_bs_back = ptr_bs;
        int nalu_length = -1;
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs])
            {
                ptr_bs += 2;
                continue;
            }
            if(ptr_bs != ptr_bs_back && !bs[ptr_bs - 1])
                ptr_bs--;
            if(ptr_bs + 2 < bs_len && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] <= 3)
            {
                if(bs[ptr_bs + 2] != 3)
                    nalu_length = ptr_bs - ptr_bs_back;
                break;
            }
            ptr_bs += 2;
        }
        uint8_t *rbsp = (uint8_t *)(bs + ptr_bs_back);
        int rbsp_len = nalu_length;

        //4. Has 0x000003, very rare
        if(nalu_length == -1)
        {
            fd_fast_realloc((void **)&h->rbsp_buffer, &h->rbsp_buffer_size, bs_len - ptr_bs_back + 16);
            if(!h->rbsp_buffer)
            {
                fprintf(stderr, "Error Alloc memory for RBSP\n");
                return -1;
            }
            rbsp = h->rbsp_buffer;
            memcpy(rbsp, bs + ptr_bs_back, ptr_bs - ptr_bs_back);
            int si = ptr_bs;
            int di = ptr_bs - ptr_bs_back;
            while(si + 2 < bs_len)
            {
                if(bs[si + 2] > 3)
                {
                    rbsp[di++] = bs[si++];
                    rbsp[di++] = bs[si++];
                }
                else if(bs[si] == 0 && bs[si + 1] == 0)
                {
                    if(bs[si + 2] == 3)
                    {
                        rbsp[di++] = 0;
                        rbsp[di++] = 0;
                        si += 3;
                        continue;
                    }
                    goto nsc;
                }
                rbsp[di++] = bs[si++];
            }
            while(si < bs_len)
                rbsp[di++] = bs[si++];
nsc:
            rbsp_len = di;
            ptr_bs = si;
        }
//        for(int i = 0; i < rbsp_len; i++)
//            printf("%02x\n", rbsp[i]);

        while(rbsp_len && rbsp[rbsp_len - 1] == 0)
            rbsp_len--;
        //5. Initial get bits context
        init_get_bits8(&h->gb, rbsp, rbsp_len);

        //6. Decode this NAL Unit with this RBSP.
        decode_nal_unit(h);
    }
    return 0;
}